

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O1

int64_t __thiscall
TPZCompElHCurl<pzshape::TPZShapeQuad>::ConnectIndex
          (TPZCompElHCurl<pzshape::TPZShapeQuad> *this,int con)

{
  int iVar1;
  ostream *this_00;
  long *plVar2;
  
  if (-1 < con) {
    iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))(this);
    if (con < iVar1) {
      return (this->fConnectIndexes).super_TPZVec<long>.fStore[(uint)con];
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "virtual int64_t TPZCompElHCurl<pzshape::TPZShapeQuad>::ConnectIndex(int) const [TSHAPE = pzshape::TPZShapeQuad]"
             ,0x6f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," wrong parameter connect ",0x19);
  this_00 = (ostream *)std::ostream::operator<<(&std::cout,con);
  std::__ostream_insert<char,std::char_traits<char>>(this_00," NConnects ",0xb);
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x90))(this);
  plVar2 = (long *)std::ostream::operator<<(this_00,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
             ,0xcf);
}

Assistant:

int64_t TPZCompElHCurl<TSHAPE>::ConnectIndex(int con) const{
#ifndef PZNODEBUG
    if(con <0 || con >= this->NConnects()) {
        std::cout <<__PRETTY_FUNCTION__ <<" wrong parameter connect " << con <<
                  " NConnects " << this-> NConnects() << std::endl;
        DebugStop();
        return -1;
    }

#endif
    return this->fConnectIndexes[con];
}